

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<tinyusdz::value::half,_4UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_value<std::array<tinyusdz::value::half,4ul>>
          (optional<std::array<tinyusdz::value::half,_4UL>_> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<std::array<tinyusdz::value::half,_4UL>_> local_22;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<std::array<tinyusdz::value::half,4ul>>
              (&local_22,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_22.has_value_;
    if (local_22.has_value_ != true) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->contained = local_22.contained;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  __return_storage_ptr__->contained = (storage_t<std::array<tinyusdz::value::half,_4UL>_>)0x0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }